

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp.c
# Opt level: O0

int read_os2_bminfoheader(ALLEGRO_FILE *f,BMPINFOHEADER *infoheader)

{
  ushort uVar1;
  ushort uVar2;
  undefined2 uVar3;
  int iVar4;
  ulong uVar5;
  ulong *in_RSI;
  undefined8 in_RDI;
  OS2BMPINFOHEADER os2_infoheader;
  int local_4;
  
  uVar1 = al_fread16le(in_RDI);
  uVar2 = al_fread16le(in_RDI);
  al_fread16le(in_RDI);
  uVar3 = al_fread16le(in_RDI);
  *in_RSI = (ulong)uVar1;
  in_RSI[1] = (ulong)uVar2;
  *(undefined2 *)(in_RSI + 2) = uVar3;
  in_RSI[3] = 0;
  in_RSI[4] = 0;
  uVar5 = al_feof(in_RDI);
  if (((uVar5 & 1) == 0) && (iVar4 = al_ferror(in_RDI), iVar4 == 0)) {
    local_4 = 0;
  }
  else {
    uVar5 = _al_trace_prefix(__al_debug_channel,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/image/bmp.c"
                             ,0xb8,"read_os2_bminfoheader");
    if ((uVar5 & 1) != 0) {
      _al_trace_suffix("Failed to read file header\n");
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int read_os2_bminfoheader(ALLEGRO_FILE *f, BMPINFOHEADER *infoheader)
{
   OS2BMPINFOHEADER os2_infoheader;

   os2_infoheader.biWidth = (uint16_t)al_fread16le(f);
   os2_infoheader.biHeight = (uint16_t)al_fread16le(f);
   os2_infoheader.biPlanes = (uint16_t)al_fread16le(f);
   os2_infoheader.biBitCount = (uint16_t)al_fread16le(f);

   infoheader->biWidth = os2_infoheader.biWidth;
   infoheader->biHeight = os2_infoheader.biHeight;
   infoheader->biBitCount = os2_infoheader.biBitCount;
   infoheader->biCompression = BIT_RGB;
   infoheader->biClrUsed = 0; /* default */

   if (al_feof(f) || al_ferror(f)) {
      ALLEGRO_ERROR("Failed to read file header\n");
      return -1;
   }

   return 0;
}